

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_info.h
# Opt level: O3

void __thiscall nodecpp::StackInfo::~StackInfo(StackInfo *this)

{
  char *pcVar1;
  void **__ptr;
  
  this->_vptr_StackInfo = (_func_int **)&PTR__StackInfo_00129698;
  if (((this->whereTaken).fromLiteral == false) &&
     (pcVar1 = (this->whereTaken).str, pcVar1 != (char *)0x0)) {
    free(pcVar1);
    (this->whereTaken).str = (char *)0x0;
  }
  if (((this->stripPoint).fromLiteral == false) &&
     (pcVar1 = (this->stripPoint).str, pcVar1 != (char *)0x0)) {
    free(pcVar1);
    (this->stripPoint).str = (char *)0x0;
  }
  __ptr = (this->stackPointers).ptrs;
  if (__ptr != (void **)0x0) {
    free(__ptr);
    return;
  }
  return;
}

Assistant:

virtual ~StackInfo() {}